

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O1

void test41(char *infile,char *password,char *outfile,char *xarg)

{
  int iVar1;
  
  iVar1 = qpdf_empty_pdf(qpdf);
  if (iVar1 == 0) {
    qpdf_init_write(qpdf,outfile);
    qpdf_set_static_ID(qpdf,1);
    qpdf_write(qpdf);
    report_errors();
    return;
  }
  __assert_fail("qpdf_empty_pdf(qpdf) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x4dd,"void test41(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test41(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* Empty PDF -- infile is ignored */
    assert(qpdf_empty_pdf(qpdf) == 0);
    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_write(qpdf);
    report_errors();
}